

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
          (MultiAgentDecisionProcessDiscrete *this,MultiAgentDecisionProcessDiscrete *a)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  *(undefined ***)&this->field_0x200 = &PTR__MultiAgentDecisionProcessDiscreteInterface_00607690;
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (&this->super_MultiAgentDecisionProcess,&PTR_construction_vtable_64__00607408,
             &a->super_MultiAgentDecisionProcess);
  *(undefined8 *)&this->super_MultiAgentDecisionProcess = 0x606f90;
  *(undefined8 *)&this->field_0x200 = 0x607288;
  MADPComponentDiscreteStates::MADPComponentDiscreteStates(&this->_m_S);
  MADPComponentDiscreteActions::MADPComponentDiscreteActions(&this->_m_A);
  MADPComponentDiscreteObservations::MADPComponentDiscreteObservations(&this->_m_O);
  MADPComponentDiscreteStates::operator=(&this->_m_S,&a->_m_S);
  MADPComponentDiscreteActions::operator=(&this->_m_A,&a->_m_A);
  MADPComponentDiscreteObservations::operator=(&this->_m_O,&a->_m_O);
  this->_m_initialized = a->_m_initialized;
  this->_m_sparse = a->_m_sparse;
  this->_m_eventObservability = a->_m_eventObservability;
  iVar1 = (*(a->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
            _vptr_TransitionModel[2])();
  this->_m_p_tModel = (TransitionModelDiscrete *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(a->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
            _vptr_ObservationModel[2])();
  this->_m_p_oModel = (ObservationModelDiscrete *)CONCAT44(extraout_var_00,iVar1);
  this->_m_falseNegativeObs = a->_m_falseNegativeObs;
  return;
}

Assistant:

MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete(
    const MultiAgentDecisionProcessDiscrete& a) :
    MultiAgentDecisionProcessDiscreteInterface(a),
    MultiAgentDecisionProcess(a)
{
    _m_S=a._m_S;
    _m_A=a._m_A;
    _m_O=a._m_O;
    _m_initialized=a._m_initialized;
    _m_sparse=a._m_sparse;
    _m_eventObservability=a._m_eventObservability;
    _m_p_tModel=a._m_p_tModel->Clone();
    _m_p_oModel=a._m_p_oModel->Clone();
    _m_falseNegativeObs = a._m_falseNegativeObs;
}